

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robotKuka.cpp
# Opt level: O3

void split_pose(Pose pose,double time,RobotKuka *robotKuka)

{
  Pose *this;
  iterator *piVar1;
  _Elt_pointer pPVar2;
  ostream *poVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  Pose package_speed;
  Pose package_move;
  bool local_65;
  float local_64;
  Pose local_60;
  Pose local_48;
  
  fVar6 = (float)(int)time / robotKuka->CYCLE_TIME;
  iVar5 = (int)fVar6;
  fVar7 = Pose::get_x(&pose);
  fVar16 = (float)(int)fVar6;
  fVar6 = Pose::get_y(&pose);
  fVar8 = Pose::get_z(&pose);
  fVar9 = Pose::get_a(&pose);
  local_64 = Pose::get_b(&pose);
  local_64 = local_64 / fVar16;
  fVar10 = Pose::get_c(&pose);
  Pose::Pose(&local_48,fVar7 / fVar16,fVar6 / fVar16,fVar8 / fVar16,fVar9 / fVar16,local_64,
             fVar10 / fVar16);
  fVar16 = Pose::get_x(&local_48);
  fVar6 = robotKuka->CYCLE_TIME;
  fVar11 = Pose::get_y(&local_48);
  fVar7 = robotKuka->CYCLE_TIME;
  fVar12 = Pose::get_z(&local_48);
  fVar8 = robotKuka->CYCLE_TIME;
  fVar13 = Pose::get_a(&local_48);
  fVar9 = robotKuka->CYCLE_TIME;
  fVar14 = Pose::get_b(&local_48);
  fVar10 = robotKuka->CYCLE_TIME;
  fVar15 = Pose::get_c(&local_48);
  Pose::Pose(&local_60,fVar16 / fVar6,fVar11 / fVar7,fVar12 / fVar8,fVar13 / fVar9,fVar14 / fVar10,
             fVar15 / robotKuka->CYCLE_TIME);
  Pose::print(&local_60);
  this = &robotKuka->security_limit_speed;
  Pose::print(this);
  fVar6 = Pose::get_x(&local_60);
  fVar7 = Pose::get_x(this);
  if (fVar6 <= fVar7) {
    fVar6 = Pose::get_y(&local_60);
    fVar7 = Pose::get_y(this);
    if (fVar6 <= fVar7) {
      fVar6 = Pose::get_z(&local_60);
      fVar7 = Pose::get_z(this);
      if (fVar6 <= fVar7) {
        fVar6 = Pose::get_a(&local_60);
        fVar7 = Pose::get_a(this);
        if (fVar6 <= fVar7) {
          fVar6 = Pose::get_b(&local_60);
          fVar7 = Pose::get_b(this);
          if (fVar6 <= fVar7) {
            fVar6 = Pose::get_c(&local_60);
            fVar7 = Pose::get_c(this);
            if (fVar6 <= fVar7) {
              fVar6 = Pose::get_x(&local_60);
              fVar7 = Pose::get_x(this);
              if (fVar6 <= fVar7 * 0.5) {
                fVar6 = Pose::get_y(&local_60);
                fVar7 = Pose::get_y(this);
                if (fVar6 <= fVar7 * 0.5) {
                  fVar6 = Pose::get_z(&local_60);
                  fVar7 = Pose::get_z(this);
                  if (fVar6 <= fVar7 * 0.5) {
                    fVar6 = Pose::get_a(&local_60);
                    fVar7 = Pose::get_a(this);
                    if (fVar6 <= fVar7 * 0.5) {
                      fVar6 = Pose::get_b(&local_60);
                      fVar7 = Pose::get_b(this);
                      if (fVar6 <= fVar7 * 0.5) {
                        fVar6 = Pose::get_c(&local_60);
                        fVar7 = Pose::get_c(this);
                        if (fVar6 <= fVar7 * 0.5) goto LAB_00106b2b;
                      }
                    }
                  }
                }
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "WARNING | Security: half of security_limit_speed exceeded while planning path. Check the log."
                         ,0x5d);
              std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
              goto LAB_00106b2b;
            }
          }
        }
      }
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "ERROR | Security: security_limit_speed exceeded while planning path. Check the log.",
             0x53);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  robotKuka->communicator_running_flag = &local_65;
LAB_00106b2b:
  if (0 < iVar5) {
    iVar4 = iVar5;
    do {
      pPVar2 = (robotKuka->move_queue).c.super__Deque_base<Pose,_std::allocator<Pose>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      if (pPVar2 == (robotKuka->move_queue).c.super__Deque_base<Pose,_std::allocator<Pose>_>._M_impl
                    .super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<Pose,std::allocator<Pose>>::_M_push_back_aux<Pose_const&>
                  ((deque<Pose,std::allocator<Pose>> *)&robotKuka->move_queue,&local_48);
      }
      else {
        pPVar2->b = local_48.b;
        pPVar2->c = local_48.c;
        pPVar2->x = local_48.x;
        pPVar2->y = local_48.y;
        pPVar2->z = local_48.z;
        pPVar2->a = local_48.a;
        piVar1 = &(robotKuka->move_queue).c.super__Deque_base<Pose,_std::allocator<Pose>_>._M_impl.
                  super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"LOG | ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar5);
  poVar3 = std::operator<<(poVar3," elements pushed to move_queue.");
  std::endl<char,std::char_traits<char>>(poVar3);
  pthread_exit((void *)0x0);
}

Assistant:

void split_pose(Pose pose, double time, RobotKuka* robotKuka)
{
	int packages_ammount = (int) time/robotKuka->CYCLE_TIME;

	Pose package_move(	pose.get_x()/packages_ammount, 
						pose.get_y()/packages_ammount, 
						pose.get_z()/packages_ammount, 
						pose.get_a()/packages_ammount, 
						pose.get_b()/packages_ammount, 
						pose.get_c()/packages_ammount);

	Pose package_speed(	package_move.get_x()/robotKuka->CYCLE_TIME, 
						package_move.get_y()/robotKuka->CYCLE_TIME, 
						package_move.get_z()/robotKuka->CYCLE_TIME, 
						package_move.get_a()/robotKuka->CYCLE_TIME, 
						package_move.get_b()/robotKuka->CYCLE_TIME, 
						package_move.get_c()/robotKuka->CYCLE_TIME);

	package_speed.print();

	robotKuka->security_limit_speed.print();

	if(package_speed.get_x() > robotKuka->security_limit_speed.get_x() || 
	   package_speed.get_y() > robotKuka->security_limit_speed.get_y() || 
	   package_speed.get_z() > robotKuka->security_limit_speed.get_z() || 
	   package_speed.get_a() > robotKuka->security_limit_speed.get_a() || 
	   package_speed.get_b() > robotKuka->security_limit_speed.get_b() || 
	   package_speed.get_c() > robotKuka->security_limit_speed.get_c())
	{
		std::cout << "ERROR | Security: security_limit_speed exceeded while planning path. Check the log." << std::endl;
		robotKuka->stopCommunicator();
	} else if(package_speed.get_x() > robotKuka->security_limit_speed.get_x()/2 || 
	   		  package_speed.get_y() > robotKuka->security_limit_speed.get_y()/2 || 
	   		  package_speed.get_z() > robotKuka->security_limit_speed.get_z()/2 || 
	   		  package_speed.get_a() > robotKuka->security_limit_speed.get_a()/2 || 
	   		  package_speed.get_b() > robotKuka->security_limit_speed.get_b()/2 || 
	   		  package_speed.get_c() > robotKuka->security_limit_speed.get_c()/2)
	{
		std::cout << "WARNING | Security: half of security_limit_speed exceeded while planning path. Check the log." << std::endl;
	}

	for(int i = 0; i < packages_ammount; i++)
	{
		try
		{
			robotKuka->move_queue.push(package_move);
		}
		catch(int e)
		{
			std::cout << "ERROR | Exception: problem while pushing element to move_queue (" << e << ") . Check the log." << std::endl;
		}
	}

	std::cout << "LOG | " << packages_ammount << " elements pushed to move_queue." << std::endl;

	pthread_exit(NULL);
}